

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGDumpDefine(FILE *output,xmlRelaxNGDefinePtr_conflict define)

{
  size_t __size;
  char *__ptr;
  xmlRelaxNGDefinePtr pxVar1;
  
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return;
  }
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    __ptr = "<empty/>\n";
    goto LAB_0018c2fa;
  case XML_RELAXNG_NOT_ALLOWED:
    __ptr = "<notAllowed/>\n";
    goto LAB_0018c3f6;
  default:
    return;
  case XML_RELAXNG_TEXT:
    __ptr = "<text/>\n";
    goto LAB_0018c1b3;
  case XML_RELAXNG_ELEMENT:
    fwrite("<element>\n",10,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fwrite("<name",5,1,(FILE *)output);
      if (define->ns != (xmlChar *)0x0) {
        fprintf((FILE *)output," ns=\"%s\"");
      }
      fprintf((FILE *)output,">%s</name>\n",define->name);
    }
    for (pxVar1 = define->attrs; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar1 = pxVar1->next)
    {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</element>\n";
    __size = 0xb;
    break;
  case XML_RELAXNG_LIST:
    fwrite("<list>\n",7,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</list>\n";
LAB_0018c1b3:
    __size = 8;
    break;
  case XML_RELAXNG_ATTRIBUTE:
    fwrite("<attribute>\n",0xc,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</attribute>\n";
    goto LAB_0018c203;
  case XML_RELAXNG_DEF:
    fwrite("<define",7,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</define>\n";
    goto LAB_0018c2b6;
  case XML_RELAXNG_REF:
    fwrite("<ref",4,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</ref>\n";
    __size = 7;
    break;
  case XML_RELAXNG_EXTERNALREF:
    fwrite("<externalRef>",0xd,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</externalRef>\n";
    __size = 0xf;
    break;
  case XML_RELAXNG_PARENTREF:
    fwrite("<parentRef",10,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</parentRef>\n";
    goto LAB_0018c203;
  case XML_RELAXNG_OPTIONAL:
    fwrite("<optional>\n",0xb,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</optional>\n";
    __size = 0xc;
    break;
  case XML_RELAXNG_ZEROORMORE:
    fwrite("<zeroOrMore>\n",0xd,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</zeroOrMore>\n";
    goto LAB_0018c3f6;
  case XML_RELAXNG_ONEORMORE:
    fwrite("<oneOrMore>\n",0xc,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</oneOrMore>\n";
LAB_0018c203:
    __size = 0xd;
    break;
  case XML_RELAXNG_CHOICE:
    fwrite("<choice>\n",9,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</choice>\n";
LAB_0018c2b6:
    __size = 10;
    break;
  case XML_RELAXNG_GROUP:
    fwrite("<group>\n",8,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</group>\n";
LAB_0018c2fa:
    __size = 9;
    break;
  case XML_RELAXNG_INTERLEAVE:
    fwrite("<interleave>\n",0xd,1,(FILE *)output);
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    __ptr = "</interleave>\n";
LAB_0018c3f6:
    __size = 0xe;
    break;
  case XML_RELAXNG_NOOP:
    for (pxVar1 = define->content; pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar1 = pxVar1->next) {
      xmlRelaxNGDumpDefine(output,pxVar1);
    }
    return;
  }
  fwrite(__ptr,__size,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlRelaxNGDumpDefine(FILE * output, xmlRelaxNGDefinePtr define)
{
    if (define == NULL)
        return;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
            fprintf(output, "<empty/>\n");
            break;
        case XML_RELAXNG_NOT_ALLOWED:
            fprintf(output, "<notAllowed/>\n");
            break;
        case XML_RELAXNG_TEXT:
            fprintf(output, "<text/>\n");
            break;
        case XML_RELAXNG_ELEMENT:
            fprintf(output, "<element>\n");
            if (define->name != NULL) {
                fprintf(output, "<name");
                if (define->ns != NULL)
                    fprintf(output, " ns=\"%s\"", define->ns);
                fprintf(output, ">%s</name>\n", define->name);
            }
            xmlRelaxNGDumpDefines(output, define->attrs);
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</element>\n");
            break;
        case XML_RELAXNG_LIST:
            fprintf(output, "<list>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</list>\n");
            break;
        case XML_RELAXNG_ONEORMORE:
            fprintf(output, "<oneOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</oneOrMore>\n");
            break;
        case XML_RELAXNG_ZEROORMORE:
            fprintf(output, "<zeroOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</zeroOrMore>\n");
            break;
        case XML_RELAXNG_CHOICE:
            fprintf(output, "<choice>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</choice>\n");
            break;
        case XML_RELAXNG_GROUP:
            fprintf(output, "<group>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</group>\n");
            break;
        case XML_RELAXNG_INTERLEAVE:
            fprintf(output, "<interleave>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</interleave>\n");
            break;
        case XML_RELAXNG_OPTIONAL:
            fprintf(output, "<optional>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</optional>\n");
            break;
        case XML_RELAXNG_ATTRIBUTE:
            fprintf(output, "<attribute>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</attribute>\n");
            break;
        case XML_RELAXNG_DEF:
            fprintf(output, "<define");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</define>\n");
            break;
        case XML_RELAXNG_REF:
            fprintf(output, "<ref");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</ref>\n");
            break;
        case XML_RELAXNG_PARENTREF:
            fprintf(output, "<parentRef");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</parentRef>\n");
            break;
        case XML_RELAXNG_EXTERNALREF:
            fprintf(output, "<externalRef>");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</externalRef>\n");
            break;
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_VALUE:
            /* TODO */
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_PARAM:
            /* TODO */
            break;
        case XML_RELAXNG_NOOP:
            xmlRelaxNGDumpDefines(output, define->content);
            break;
    }
}